

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chan_generaterhythm2(opl_chip *chip)

{
  uint uVar1;
  uint uVar2;
  opl_slot *poVar3;
  Bit16s BVar4;
  
  poVar3 = chip->channel[6].slots[1];
  BVar4 = (*envelope_sin[poVar3->reg_wf])
                    ((short)(poVar3->pg_phase >> 9) + *poVar3->mod,poVar3->eg_out);
  poVar3->out = BVar4;
  uVar1 = chip->channel[7].slots[0]->pg_phase;
  uVar2 = chip->channel[8].slots[1]->pg_phase;
  poVar3 = chip->channel[7].slots[1];
  BVar4 = (*envelope_sin[poVar3->reg_wf])
                    ((ushort)((chip->noise & 1) << 8) ^
                     (ushort)(0x100 << ((byte)(uVar1 >> 0x11) & 1)),poVar3->eg_out);
  poVar3->out = BVar4;
  poVar3 = chip->channel[8].slots[1];
  BVar4 = (*envelope_sin[poVar3->reg_wf])
                    ((ushort)(((uVar2 >> 0xb ^ uVar2 >> 9 | uVar1 >> 9) & 8) != 0 ||
                             ((uVar1 >> 0xe ^ uVar1 >> 9) & 4) != 0) << 9 | 0x100,poVar3->eg_out);
  poVar3->out = BVar4;
  return;
}

Assistant:

void chan_generaterhythm2(opl_chip *chip) {
	opl_channel *channel6 = &chip->channel[6];
	opl_channel *channel7 = &chip->channel[7];
	opl_channel *channel8 = &chip->channel[8];
	slot_generate(channel6->slots[1]);
	Bit16u phase14 = (channel7->slots[0]->pg_phase >> 9) & 0x3ff;
	Bit16u phase17 = (channel8->slots[1]->pg_phase >> 9) & 0x3ff;
	Bit16u phase = 0x00;
	//hh tc phase bit
	Bit16u phasebit = ((phase14 & 0x08) | (((phase14 >> 5) ^ phase14) & 0x04) | (((phase17 >> 2) ^ phase17) & 0x08)) ? 0x01 : 0x00;
	//sd
	phase = (0x100 << ((phase14 >> 8) & 0x01)) ^ ((chip->noise & 0x01) << 8);
	slot_generatephase(channel7->slots[1], phase);
	//tc
	phase = 0x100 | (phasebit << 9);
	slot_generatephase(channel8->slots[1], phase);
}